

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O0

void __thiscall
net_tests::anon_unknown_17::V2TransportTester::AddMessage
          (V2TransportTester *this,string *m_type,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *payload)

{
  long lVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  long in_FS_OFFSET;
  CSerializedNetMsg msg;
  CSerializedNetMsg *in_stack_ffffffffffffff68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CSerializedNetMsg::CSerializedNetMsg(in_stack_ffffffffffffff68);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (in_RSI,in_stack_ffffffffffffff70);
  std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::push_back
            ((deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_> *)
             in_stack_ffffffffffffff68,(value_type *)0x87686e);
  CSerializedNetMsg::~CSerializedNetMsg(in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddMessage(std::string m_type, std::vector<uint8_t> payload)
    {
        CSerializedNetMsg msg;
        msg.m_type = std::move(m_type);
        msg.data = std::move(payload);
        m_msg_to_send.push_back(std::move(msg));
    }